

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>_> * __thiscall
kj::ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>_>::operator=
          (ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>_> *this,
          ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>_> *other)

{
  Own<capnp::_::SegmentBuilder> *pOVar1;
  RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *pRVar2;
  Own<capnp::_::SegmentBuilder> *pOVar3;
  ArrayDisposer *pAVar4;
  
  pOVar1 = this->ptr;
  if (pOVar1 != (Own<capnp::_::SegmentBuilder> *)0x0) {
    pRVar2 = this->pos;
    pOVar3 = this->endPtr;
    this->ptr = (Own<capnp::_::SegmentBuilder> *)0x0;
    this->pos = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0;
    this->endPtr = (Own<capnp::_::SegmentBuilder> *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pOVar1,0x10,(long)pRVar2 - (long)pOVar1 >> 4,
               (long)pOVar3 - (long)pOVar1 >> 4,
               ArrayDisposer::Dispose_<kj::Own<capnp::_::SegmentBuilder>,_false>::destruct);
  }
  pRVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (Own<capnp::_::SegmentBuilder> *)0x0;
  other->pos = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0;
  other->endPtr = (Own<capnp::_::SegmentBuilder> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }